

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_tessellator.cc
# Opt level: O1

void __thiscall
S2EdgeTessellator::AppendUnprojected
          (S2EdgeTessellator *this,R2Point *pa,R2Point *pb,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  pointer *ppVVar1;
  iterator __position;
  bool bVar2;
  S2Point a;
  S2Point b;
  S2Point local_70;
  S2Point local_58;
  S2LogMessage local_40;
  
  (*this->proj_->_vptr_Projection[3])(&local_70,this->proj_,pa);
  (*this->proj_->_vptr_Projection[3])(&local_58,this->proj_,pb);
  __position._M_current =
       (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if ((vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
      super__Vector_impl_data._M_start == __position._M_current) {
    if (__position._M_current ==
        (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
      _M_realloc_insert<Vector3<double>const&>
                ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)vertices,__position,
                 &local_70);
    }
    else {
      (__position._M_current)->c_[2] = local_70.c_[2];
      (__position._M_current)->c_[0] = local_70.c_[0];
      (__position._M_current)->c_[1] = local_70.c_[1];
      ppVVar1 = &(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppVVar1 = *ppVVar1 + 1;
    }
  }
  else {
    bVar2 = S2::ApproxEquals(__position._M_current + -1,&local_70,(S1Angle)0x3cd203af9ee75616);
    if (!bVar2) {
      S2LogMessage::S2LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_tessellator.cc"
                 ,0xff,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,"Check failed: S2::ApproxEquals(vertices->back(), a) ",0x34);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,"Appended edges must form a chain",0x20);
      if (!bVar2) {
        abort();
      }
    }
  }
  AppendUnprojected(this,pa,&local_70,pb,&local_58,vertices);
  return;
}

Assistant:

void S2EdgeTessellator::AppendUnprojected(
    const R2Point& pa, const R2Point& pb, vector<S2Point>* vertices) const {
  S2Point a = proj_.Unproject(pa);
  S2Point b = proj_.Unproject(pb);
  if (vertices->empty()) {
    vertices->push_back(a);
  } else {
    // Note that coordinate wrapping can create a small amount of error.  For
    // example in the edge chain "0:-175, 0:179, 0:-177", the first edge is
    // transformed into "0:-175, 0:-181" while the second is transformed into
    // "0:179, 0:183".  The two coordinate pairs for the middle vertex
    // ("0:-181" and "0:179") may not yield exactly the same S2Point.
    S2_DCHECK(S2::ApproxEquals(vertices->back(), a))
        << "Appended edges must form a chain";
  }
  AppendUnprojected(pa, a, pb, b, vertices);
}